

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int op_http_conn_read_ahead
              (OpusHTTPStream *_stream,OpusHTTPConn *_conn,int _just_read_ahead,opus_int64 _target)

{
  long lVar1;
  long lVar2;
  opus_int64 oVar3;
  int iVar4;
  int local_a0;
  int local_88;
  opus_int64 local_70;
  opus_int64 next_next_end;
  opus_int64 next_next_pos;
  int ret;
  ptrdiff_t nread;
  opus_int64 next_end;
  opus_int64 next_pos;
  opus_int64 end_pos;
  opus_int64 pos;
  opus_int64 _target_local;
  int _just_read_ahead_local;
  OpusHTTPConn *_conn_local;
  OpusHTTPStream *_stream_local;
  
  end_pos = _conn->pos;
  lVar1 = _conn->end_pos;
  lVar2 = _conn->next_pos;
  next_pos = _conn->next_end;
  if (_just_read_ahead == 0) {
    _conn->next_pos = -1;
    iVar4 = op_http_conn_send_request(_stream,_conn,_target,0x8000,0);
    if (iVar4 < 0) {
      return iVar4;
    }
  }
  if (((_just_read_ahead == 0) ||
      ((oVar3 = _target, -1 < lVar1 && (oVar3 = _target, lVar1 <= _target)))) &&
     (oVar3 = lVar1, -1 < lVar2)) {
    for (; end_pos < lVar1; end_pos = iVar4 + end_pos) {
      if (lVar1 - end_pos < (long)(_stream->response).cbuf) {
        local_88 = (int)lVar1 - (int)end_pos;
      }
      else {
        local_88 = (_stream->response).cbuf;
      }
      iVar4 = op_http_conn_read(_conn,(_stream->response).buf,local_88,1);
      if ((long)iVar4 < 1) {
        return -1;
      }
    }
    if (_just_read_ahead == 0) {
      local_70 = _conn->next_end;
      _conn->next_pos = lVar2;
      _conn->next_end = next_pos;
      next_next_end = _target;
    }
    else {
      local_70 = -1;
      next_next_end = -1;
      next_pos = _target;
    }
    iVar4 = op_http_conn_handle_response(_stream,_conn);
    if (iVar4 != 0) {
      return -1;
    }
    _conn->next_pos = next_next_end;
    _conn->next_end = local_70;
    oVar3 = next_pos;
  }
  while( true ) {
    next_pos = oVar3;
    if (next_pos <= end_pos) {
      if (_just_read_ahead == 0) {
        iVar4 = op_http_conn_handle_response(_stream,_conn);
        if (iVar4 != 0) {
          return -1;
        }
      }
      else {
        _conn->pos = next_pos;
      }
      return 0;
    }
    if (next_pos - end_pos < (long)(_stream->response).cbuf) {
      local_a0 = (int)next_pos - (int)end_pos;
    }
    else {
      local_a0 = (_stream->response).cbuf;
    }
    iVar4 = op_http_conn_read(_conn,(_stream->response).buf,local_a0,1);
    if ((long)iVar4 < 1) break;
    end_pos = iVar4 + end_pos;
    oVar3 = next_pos;
  }
  return -1;
}

Assistant:

static int op_http_conn_read_ahead(OpusHTTPStream *_stream,
 OpusHTTPConn *_conn,int _just_read_ahead,opus_int64 _target){
  opus_int64 pos;
  opus_int64 end_pos;
  opus_int64 next_pos;
  opus_int64 next_end;
  ptrdiff_t  nread;
  int        ret;
  pos=_conn->pos;
  end_pos=_conn->end_pos;
  next_pos=_conn->next_pos;
  next_end=_conn->next_end;
  if(!_just_read_ahead){
    /*We need to issue a new pipelined request.
      This is the only case where we allow more than one outstanding request
       at a time, so we need to reset next_pos (we'll restore it below if we
       did have an outstanding request).*/
    OP_ASSERT(_stream->pipeline);
    _conn->next_pos=-1;
    ret=op_http_conn_send_request(_stream,_conn,_target,
     OP_PIPELINE_CHUNK_SIZE,0);
    if(OP_UNLIKELY(ret<0))return ret;
  }
  /*We can reach the target position by reading forward in the current chunk.*/
  if(_just_read_ahead&&(end_pos<0||_target<end_pos))end_pos=_target;
  else if(next_pos>=0){
    opus_int64 next_next_pos;
    opus_int64 next_next_end;
    /*We already have a request outstanding.
      Finish off the current chunk.*/
    while(pos<end_pos){
      nread=op_http_conn_read(_conn,_stream->response.buf,
       (int)OP_MIN(end_pos-pos,_stream->response.cbuf),1);
      /*We failed to read ahead.*/
      if(nread<=0)return OP_FALSE;
      pos+=nread;
    }
    OP_ASSERT(pos==end_pos);
    if(_just_read_ahead){
      next_next_pos=next_next_end=-1;
      end_pos=_target;
    }
    else{
      OP_ASSERT(_conn->next_pos==_target);
      next_next_pos=_target;
      next_next_end=_conn->next_end;
      _conn->next_pos=next_pos;
      _conn->next_end=next_end;
      end_pos=next_end;
    }
    ret=op_http_conn_handle_response(_stream,_conn);
    if(OP_UNLIKELY(ret!=0))return OP_FALSE;
    _conn->next_pos=next_next_pos;
    _conn->next_end=next_next_end;
  }
  while(pos<end_pos){
    nread=op_http_conn_read(_conn,_stream->response.buf,
     (int)OP_MIN(end_pos-pos,_stream->response.cbuf),1);
    /*We failed to read ahead.*/
    if(nread<=0)return OP_FALSE;
    pos+=nread;
  }
  OP_ASSERT(pos==end_pos);
  if(!_just_read_ahead){
    ret=op_http_conn_handle_response(_stream,_conn);
    if(OP_UNLIKELY(ret!=0))return OP_FALSE;
  }
  else _conn->pos=end_pos;
  OP_ASSERT(_conn->pos==_target);
  return 0;
}